

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_tt_PackFontRangesGatherRects
              (nk_tt_pack_context *spc,nk_tt_fontinfo *info,nk_tt_pack_range *ranges,int num_ranges,
              nk_rp_rect *rects)

{
  int glyph_00;
  int local_64;
  float local_60;
  int glyph;
  int codepoint;
  int y1;
  int x1;
  int y0;
  int x0;
  float scale;
  float fh;
  int k;
  int j;
  int i;
  nk_rp_rect *rects_local;
  nk_tt_pack_range *pnStack_20;
  int num_ranges_local;
  nk_tt_pack_range *ranges_local;
  nk_tt_fontinfo *info_local;
  nk_tt_pack_context *spc_local;
  
  scale = 0.0;
  _j = rects;
  rects_local._4_4_ = num_ranges;
  pnStack_20 = ranges;
  ranges_local = (nk_tt_pack_range *)info;
  info_local = (nk_tt_fontinfo *)spc;
  for (k = 0; k < rects_local._4_4_; k = k + 1) {
    x0 = (int)pnStack_20[k].font_size;
    if ((float)x0 <= 0.0) {
      local_60 = nk_tt_ScaleForMappingEmToPixels((nk_tt_fontinfo *)ranges_local,-(float)x0);
    }
    else {
      local_60 = nk_tt_ScaleForPixelHeight((nk_tt_fontinfo *)ranges_local,(float)x0);
    }
    y0 = (int)local_60;
    pnStack_20[k].h_oversample = (uchar)info_local->glyf;
    pnStack_20[k].v_oversample = (uchar)info_local->hhea;
    for (fh = 0.0; (int)fh < pnStack_20[k].num_chars; fh = (float)((int)fh + 1)) {
      if (pnStack_20[k].first_unicode_codepoint_in_range == 0) {
        local_64 = pnStack_20[k].array_of_unicode_codepoints[(int)fh];
      }
      else {
        local_64 = pnStack_20[k].first_unicode_codepoint_in_range + (int)fh;
      }
      glyph_00 = nk_tt_FindGlyphIndex((nk_tt_fontinfo *)ranges_local,local_64);
      nk_tt_GetGlyphBitmapBoxSubpixel
                ((nk_tt_fontinfo *)ranges_local,glyph_00,(float)y0 * (float)(uint)info_local->glyf,
                 (float)y0 * (float)(uint)info_local->hhea,0.0,0.0,&x1,&y1,&codepoint,&glyph);
      _j[(int)scale].w =
           (((short)codepoint - (short)x1) + (short)info_local->head + (short)info_local->glyf) - 1;
      _j[(int)scale].h =
           (((short)glyph - (short)y1) + (short)info_local->head + (short)info_local->hhea) - 1;
      scale = (float)((int)scale + 1);
    }
  }
  return (int)scale;
}

Assistant:

NK_INTERN int
nk_tt_PackFontRangesGatherRects(struct nk_tt_pack_context *spc,
    struct nk_tt_fontinfo *info, struct nk_tt_pack_range *ranges,
    int num_ranges, struct nk_rp_rect *rects)
{
    /* rects array must be big enough to accommodate all characters in the given ranges */
    int i,j,k;
    k = 0;

    for (i=0; i < num_ranges; ++i) {
        float fh = ranges[i].font_size;
        float scale = (fh > 0) ? nk_tt_ScaleForPixelHeight(info, fh):
            nk_tt_ScaleForMappingEmToPixels(info, -fh);
        ranges[i].h_oversample = (unsigned char) spc->h_oversample;
        ranges[i].v_oversample = (unsigned char) spc->v_oversample;
        for (j=0; j < ranges[i].num_chars; ++j) {
            int x0,y0,x1,y1;
            int codepoint = ranges[i].first_unicode_codepoint_in_range ?
                ranges[i].first_unicode_codepoint_in_range + j :
                ranges[i].array_of_unicode_codepoints[j];

            int glyph = nk_tt_FindGlyphIndex(info, codepoint);
            nk_tt_GetGlyphBitmapBoxSubpixel(info,glyph, scale * (float)spc->h_oversample,
                scale * (float)spc->v_oversample, 0,0, &x0,&y0,&x1,&y1);
            rects[k].w = (nk_rp_coord) (x1-x0 + spc->padding + (int)spc->h_oversample-1);
            rects[k].h = (nk_rp_coord) (y1-y0 + spc->padding + (int)spc->v_oversample-1);
            ++k;
        }
    }
    return k;
}